

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_align.h
# Opt level: O0

void * alloc_aligned(size_t size)

{
  void *res;
  size_t size_local;
  
  size_local = (size_t)mmap((void *)0x0,size + 0x3f & 0xffffffffffffffc0,3,0x22,-1,0);
  if ((void *)size_local == (void *)0xffffffffffffffff) {
    size_local = 0;
  }
  return (void *)size_local;
}

Assistant:

static inline void*
alloc_aligned(size_t size)
{ 
    // make sure size is a multiple of LINE_SIZE
    size = (size + LINE_SIZE - 1) & (~(LINE_SIZE - 1));
    void* res;
#if SYLVAN_USE_MMAP
    res = mmap(0, size, PROT_READ | PROT_WRITE, MAP_PRIVATE | MAP_ANONYMOUS, -1, 0);
    if (res == MAP_FAILED) return 0;
#else
#if defined(_MSC_VER) || defined(__MINGW64_VERSION_MAJOR)
    res = _aligned_malloc(size, LINE_SIZE);
#elif defined(__MINGW32__)
    res = __mingw_aligned_malloc(size, LINE_SIZE);
#else
    res = aligned_alloc(LINE_SIZE, size);
#endif
    if (res != 0) memset(res, 0, size);
#endif
    return res;
}